

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ulong uVar1;
  ushort uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  if (pY->nSkip <= pX->nSkip) {
    uVar2 = pX->nLTerm;
    if ((int)((uint)uVar2 - (uint)pX->nSkip) < (int)((uint)pY->nLTerm - (uint)pY->nSkip)) {
      if ((pX->rRun < pY->rRun) || ((pX->rRun <= pY->rRun && (pX->nOut <= pY->nOut)))) {
        if ((ulong)uVar2 != 0) {
          uVar5 = (ulong)uVar2;
          do {
            uVar7 = (ulong)pY->nLTerm;
            if (pX->aLTerm[uVar5 - 1] != (WhereTerm *)0x0) {
              do {
                if ((long)uVar7 < 1) {
                  iVar6 = 0;
                  goto LAB_0016e532;
                }
                uVar1 = uVar7 - 1;
                lVar4 = uVar7 - 1;
                uVar7 = uVar1;
              } while (pY->aLTerm[lVar4] != pX->aLTerm[uVar5 - 1]);
              iVar6 = (int)uVar1 + 1;
LAB_0016e532:
              if (iVar6 < 1) {
                return 0;
              }
            }
            bVar3 = 1 < (long)uVar5;
            uVar5 = uVar5 - 1;
          } while (bVar3);
        }
        if (((pX->wsFlags & 0x40) == 0) || (iVar6 = 0, (pY->wsFlags & 0x40) != 0)) {
          iVar6 = 1;
        }
        return iVar6;
      }
    }
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pY->nSkip > pX->nSkip ) return 0;
  if( pX->rRun >= pY->rRun ){
    if( pX->rRun > pY->rRun ) return 0;    /* X costs more than Y */
    if( pX->nOut > pY->nOut ) return 0;    /* X costs more than Y */
  }
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0 
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}